

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pullpush.c
# Opt level: O1

uchar * push_bytes(uchar **cursor,size_t *max,void *src,size_t len)

{
  uchar *puVar1;
  
  if ((cursor == (uchar **)0x0) || (puVar1 = *cursor, puVar1 == (uchar *)0x0)) {
    *max = *max + len;
  }
  else {
    if (len <= *max) {
      if (src != (void *)0x0) {
        memcpy(puVar1,src,len);
      }
      puVar1 = *cursor;
      *cursor = puVar1 + len;
      *max = *max - len;
      return puVar1;
    }
    if (src != (void *)0x0) {
      memcpy(puVar1,src,*max);
    }
    *max = len - *max;
    *cursor = (uchar *)0x0;
  }
  return (uchar *)0x0;
}

Assistant:

unsigned char *push_bytes(unsigned char **cursor, size_t *max,
                          const void *src, size_t len)
{
    if (cursor == NULL || *cursor == NULL) {
        *max += len;
        return NULL;
    }
    if (len > *max) {
        if (src)
            memcpy(*cursor, src, *max);
        /* From now on, max records the room we *needed* */
        *max = len - *max;
        *cursor = NULL;
        return NULL;
    }
    if (src)
        memcpy(*cursor, src, len);

    *cursor += len;
    *max -= len;

    return *cursor - len;
}